

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O1

REF_STATUS ref_recon_roundoff_limit(REF_DBL *recon,REF_GRID ref_grid)

{
  double *pdVar1;
  int iVar2;
  REF_NODE ref_node;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  void *__ptr;
  ulong uVar6;
  long lVar7;
  REF_DBL *pRVar8;
  long lVar9;
  char *pcVar10;
  ulong uVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  REF_EDGE ref_edge;
  REF_DBL diag_system [12];
  REF_EDGE local_a0;
  double local_98;
  double local_90;
  double local_88;
  
  ref_node = ref_grid->node;
  iVar2 = ref_node->max;
  uVar11 = (ulong)iVar2;
  if ((long)uVar11 < 0) {
    uVar11 = 1;
    pcVar10 = "malloc radius of REF_DBL negative";
  }
  else {
    __ptr = malloc(uVar11 * 8);
    if (__ptr != (void *)0x0) {
      bVar3 = true;
      if (iVar2 != 0) {
        uVar6 = 0;
        do {
          *(undefined8 *)((long)__ptr + uVar6 * 8) = 0xbff0000000000000;
          uVar6 = uVar6 + 1;
        } while (uVar11 != uVar6);
      }
      goto LAB_001ca3ab;
    }
    uVar11 = 2;
    pcVar10 = "malloc radius of REF_DBL NULL";
  }
  bVar3 = false;
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x4da,
         "ref_recon_roundoff_limit",pcVar10);
  __ptr = (void *)0x0;
LAB_001ca3ab:
  uVar5 = (uint)uVar11;
  if (bVar3) {
    uVar4 = ref_edge_create(&local_a0,ref_grid);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x4db
             ,"ref_recon_roundoff_limit",(ulong)uVar4,"edges");
      uVar11 = (ulong)uVar4;
    }
    uVar5 = (uint)uVar11;
    if (uVar4 == 0) {
      if (0 < local_a0->n) {
        lVar7 = 0;
        do {
          lVar9 = (long)local_a0->e2n[lVar7 * 2];
          lVar12 = (long)local_a0->e2n[lVar7 * 2 + 1];
          pRVar8 = ref_node->real;
          dVar13 = (pRVar8[lVar12 * 0xf + 2] - pRVar8[lVar9 * 0xf + 2]) *
                   (pRVar8[lVar12 * 0xf + 2] - pRVar8[lVar9 * 0xf + 2]) +
                   (pRVar8[lVar12 * 0xf + 1] - pRVar8[lVar9 * 0xf + 1]) *
                   (pRVar8[lVar12 * 0xf + 1] - pRVar8[lVar9 * 0xf + 1]) +
                   (pRVar8[lVar12 * 0xf] - pRVar8[lVar9 * 0xf]) *
                   (pRVar8[lVar12 * 0xf] - pRVar8[lVar9 * 0xf]);
          if (dVar13 < 0.0) {
            dVar13 = sqrt(dVar13);
          }
          else {
            dVar13 = SQRT(dVar13);
          }
          pdVar1 = (double *)((long)__ptr + lVar9 * 8);
          if (*pdVar1 <= 0.0 && *pdVar1 != 0.0) {
            *(double *)((long)__ptr + lVar9 * 8) = dVar13;
          }
          dVar14 = *(double *)((long)__ptr + lVar9 * 8);
          if (dVar13 <= dVar14) {
            dVar14 = dVar13;
          }
          *(double *)((long)__ptr + lVar9 * 8) = dVar14;
          pdVar1 = (double *)((long)__ptr + lVar12 * 8);
          if (*pdVar1 <= 0.0 && *pdVar1 != 0.0) {
            *(double *)((long)__ptr + lVar12 * 8) = dVar13;
          }
          dVar14 = *(double *)((long)__ptr + lVar12 * 8);
          if (dVar13 <= dVar14) {
            dVar14 = dVar13;
          }
          *(double *)((long)__ptr + lVar12 * 8) = dVar14;
          lVar7 = lVar7 + 1;
        } while (lVar7 < local_a0->n);
      }
      ref_edge_free(local_a0);
      if (0 < ref_node->max) {
        lVar7 = 0;
        pRVar8 = recon;
        do {
          if (-1 < ref_node->global[lVar7]) {
            dVar13 = *(double *)((long)__ptr + lVar7 * 8);
            dVar13 = dVar13 * dVar13;
            dVar14 = dVar13 * 1e+20;
            if (dVar14 <= -dVar14) {
              dVar14 = -dVar14;
            }
            if (dVar14 <= 4e-12) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                     ,0x4f1,"ref_recon_roundoff_limit",
                     "element with zero edge length or missing element");
              return 1;
            }
            dVar13 = 4e-12 / dVar13;
            uVar5 = ref_matrix_diag_m(pRVar8,&local_98);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                     ,0x4f8,"ref_recon_roundoff_limit",(ulong)uVar5,"eigen decomp");
              ref_matrix_show_m(pRVar8);
              ref_node_location(ref_node,(REF_INT)lVar7);
              printf("eig_floor %e radius %e\n",dVar13,*(undefined8 *)((long)__ptr + lVar7 * 8));
              uVar11 = (ulong)uVar5;
            }
            if (uVar5 != 0) {
              return (REF_STATUS)uVar11;
            }
            if (local_98 <= dVar13) {
              local_98 = dVar13;
            }
            if (local_90 <= dVar13) {
              local_90 = dVar13;
            }
            if (local_88 <= dVar13) {
              local_88 = dVar13;
            }
            uVar5 = ref_matrix_form_m(&local_98,pRVar8);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                     ,0x4ff,"ref_recon_roundoff_limit",(ulong)uVar5,"re-form hess");
              uVar11 = (ulong)uVar5;
            }
            if (uVar5 != 0) {
              return (REF_STATUS)uVar11;
            }
          }
          lVar7 = lVar7 + 1;
          pRVar8 = pRVar8 + 6;
        } while (lVar7 < ref_node->max);
      }
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      uVar5 = ref_node_ghost_dbl(ref_node,recon,6);
      if (uVar5 == 0) {
        uVar5 = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
               0x503,"ref_recon_roundoff_limit",(ulong)uVar5,"update ghosts");
      }
    }
  }
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_recon_roundoff_limit(REF_DBL *recon, REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node, node0, node1, edge;
  REF_DBL *radius, dist;
  REF_DBL round_off_jitter = 1.0e-12;
  REF_DBL eig_floor;
  REF_DBL diag_system[12];
  REF_EDGE ref_edge;

  ref_malloc_init(radius, ref_node_max(ref_node), REF_DBL, -1.0);
  RSS(ref_edge_create(&ref_edge, ref_grid), "edges");
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    dist = sqrt(
        pow(ref_node_xyz(ref_node, 0, node1) - ref_node_xyz(ref_node, 0, node0),
            2) +
        pow(ref_node_xyz(ref_node, 1, node1) - ref_node_xyz(ref_node, 1, node0),
            2) +
        pow(ref_node_xyz(ref_node, 2, node1) - ref_node_xyz(ref_node, 2, node0),
            2));
    if (radius[node0] < 0.0) radius[node0] = dist;
    radius[node0] = MIN(radius[node0], dist);
    if (radius[node1] < 0.0) radius[node1] = dist;
    radius[node1] = MIN(radius[node1], dist);
  }
  ref_edge_free(ref_edge);

  each_ref_node_valid_node(ref_node, node) {
    /* 2nd order central finite difference */
    RAS(ref_math_divisible((4 * round_off_jitter),
                           (radius[node] * radius[node])),
        "element with zero edge length or missing element");
    eig_floor = (4 * round_off_jitter) / (radius[node] * radius[node]);

    RSB(ref_matrix_diag_m(&(recon[6 * node]), diag_system), "eigen decomp", {
      ref_matrix_show_m(&(recon[6 * node]));
      ref_node_location(ref_node, node);
      printf("eig_floor %e radius %e\n", eig_floor, radius[node]);
    });
    ref_matrix_eig(diag_system, 0) =
        MAX(ref_matrix_eig(diag_system, 0), eig_floor);
    ref_matrix_eig(diag_system, 1) =
        MAX(ref_matrix_eig(diag_system, 1), eig_floor);
    ref_matrix_eig(diag_system, 2) =
        MAX(ref_matrix_eig(diag_system, 2), eig_floor);
    RSS(ref_matrix_form_m(diag_system, &(recon[6 * node])), "re-form hess");
  }
  ref_free(radius);

  RSS(ref_node_ghost_dbl(ref_node, recon, 6), "update ghosts");

  return REF_SUCCESS;
}